

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall vkb::PhysicalDevice::is_extension_present(PhysicalDevice *this,char *ext)

{
  bool bVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  char *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  anon_class_8_1_ba1d4581_for__M_pred local_18;
  char *ext_local;
  PhysicalDevice *this_local;
  
  local_18.ext = ext;
  ext_local = (char *)this;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 (&this->available_extensions);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (&this->available_extensions);
  local_38 = local_18.ext;
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,vkb::PhysicalDevice::is_extension_present(char_const*)const::__0>
                       (local_28,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_30,local_18);
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 (&this->available_extensions);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  return bVar1;
}

Assistant:

bool PhysicalDevice::is_extension_present(const char* ext) const {
    return std::find_if(std::begin(available_extensions), std::end(available_extensions), [ext](std::string const& ext_name) {
        return ext_name == ext;
    }) != std::end(available_extensions);
}